

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

shared_ptr<chatra::Node> __thiscall chatra::createNullNode(chatra *this,Token *templateToken)

{
  iterator __position;
  undefined8 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<chatra::Node> sVar3;
  Token *local_38;
  
  *(undefined8 *)this = 0;
  puVar1 = (undefined8 *)operator_new(0xd0);
  puVar1[1] = 0x100000001;
  *puVar1 = &PTR___Sp_counted_ptr_inplace_00246ba8;
  memset(puVar1 + 2,0,0xc0);
  *(undefined4 *)((long)puVar1 + 0x44) = 0xffffffff;
  puVar1[9] = 0;
  *(undefined1 *)(puVar1 + 10) = 0xff;
  *(undefined8 *)((long)puVar1 + 0x54) = 0;
  *(undefined8 *)((long)puVar1 + 0x5c) = 0;
  *(undefined8 *)((long)puVar1 + 100) = 0;
  *(undefined8 *)((long)puVar1 + 0x6c) = 0;
  *(undefined8 *)((long)puVar1 + 0x74) = 0;
  *(undefined8 *)((long)puVar1 + 0x7c) = 0;
  *(undefined8 *)((long)puVar1 + 0x84) = 0;
  *(undefined8 *)((long)puVar1 + 0x8c) = 0;
  *(undefined8 *)((long)puVar1 + 0x94) = 0;
  *(undefined8 *)((long)puVar1 + 0x9c) = 0;
  *(undefined8 *)((long)puVar1 + 0xa4) = 0;
  *(undefined8 *)((long)puVar1 + 0xac) = 0;
  *(undefined8 *)((long)puVar1 + 0xb4) = 0;
  *(undefined8 *)((long)puVar1 + 0xbc) = 0;
  puVar1[0x18] = 0;
  puVar1[0x19] = 0;
  *(undefined8 **)(this + 8) = puVar1;
  *(undefined8 **)this = puVar1 + 2;
  *(undefined1 *)(puVar1 + 2) = 0x1b;
  __position._M_current = (Token **)puVar1[6];
  if (__position._M_current == (Token **)puVar1[7]) {
    local_38 = templateToken;
    std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>::
    _M_realloc_insert<chatra::Token_const*>
              ((vector<chatra::Token_const*,std::allocator<chatra::Token_const*>> *)(puVar1 + 5),
               __position,&local_38);
    _Var2._M_pi = extraout_RDX_00;
  }
  else {
    *__position._M_current = templateToken;
    puVar1[6] = puVar1[6] + 8;
    _Var2._M_pi = extraout_RDX;
  }
  *(undefined4 *)((long)puVar1 + 0x44) = 0x68;
  sVar3.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi
  ;
  sVar3.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<chatra::Node>)
         sVar3.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<Node> createNullNode(const Token& templateToken) {
	auto n = std::make_shared<Node>();
	n->type = NodeType::Name;
	n->tokens.push_back(&templateToken);
	n->sid = StringId::Null;
	return n;
}